

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_factory.h
# Opt level: O2

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
 __thiscall
draco::
CreateMeshPredictionScheme<draco::MeshDecoder,draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>,draco::MeshPredictionSchemeDecoderFactory<int>>
          (draco *this,MeshDecoder *source,PredictionSchemeMethod method,int att_id,
          Transform *transform,uint16_t bitstream_version)

{
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined6 in_register_0000008a;
  MeshPredictionSchemeDecoderFactory<int> factory;
  undefined1 local_65;
  undefined4 local_64;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_60;
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *local_58;
  Mesh *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_64 = (undefined4)CONCAT62(in_register_0000008a,bitstream_version);
  _Var1._M_t.
  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
  super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
       (((source->super_PointCloudDecoder).point_cloud_)->attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[att_id]._M_t.
       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
       _M_t;
  iVar2 = (*(source->super_PointCloudDecoder)._vptr_PointCloudDecoder[2])(source);
  if (((uint)(method + PREDICTION_UNDEFINED) < 6) && (iVar2 == 1)) {
    local_60._M_head_impl =
         (PointAttribute *)
         _Var1._M_t.
         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
    local_58 = (MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *)transform;
    iVar2 = (*(source->super_PointCloudDecoder)._vptr_PointCloudDecoder[10])(source);
    iVar3 = (*(source->super_PointCloudDecoder)._vptr_PointCloudDecoder[0xc])
                      (source,(ulong)(uint)att_id);
    local_38 = CONCAT44(extraout_var_00,iVar3);
    if (CONCAT44(extraout_var,iVar2) != 0 && local_38 != 0) {
      iVar3 = (*(source->super_PointCloudDecoder)._vptr_PointCloudDecoder[0xb])
                        (source,(ulong)(uint)att_id);
      local_48 = CONCAT44(extraout_var_01,iVar3);
      local_40 = local_38 + 0x18;
      if (local_48 == 0) {
        local_50 = source->mesh_;
        local_48 = CONCAT44(extraout_var,iVar2);
        MeshPredictionSchemeDecoderFactory<int>::operator()
                  ((MeshPredictionSchemeDecoderFactory<int> *)this,(PredictionSchemeMethod)&local_65
                   ,(PointAttribute *)(ulong)(uint)method,
                   (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *)
                   local_60._M_head_impl,(MeshPredictionSchemeData<draco::CornerTable> *)local_58,
                   (uint16_t)&local_50);
      }
      else {
        local_50 = source->mesh_;
        MeshPredictionSchemeDecoderFactory<int>::operator()
                  ((MeshPredictionSchemeDecoderFactory<int> *)this,(PredictionSchemeMethod)&local_65
                   ,(PointAttribute *)(ulong)(uint)method,
                   (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *)
                   local_60._M_head_impl,local_58,(uint16_t)&local_50);
      }
      if (*(long *)this != 0) {
        return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
                )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
                  )this;
      }
      std::
      unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
      ::~unique_ptr((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
                     *)this);
    }
  }
  *(undefined8 *)this = 0;
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PredictionSchemeT> CreateMeshPredictionScheme(
    const EncodingDataSourceT *source, PredictionSchemeMethod method,
    int att_id, const typename PredictionSchemeT::Transform &transform,
    uint16_t bitstream_version) {
  const PointAttribute *const att = source->point_cloud()->attribute(att_id);
  if (source->GetGeometryType() == TRIANGULAR_MESH &&
      (method == MESH_PREDICTION_PARALLELOGRAM ||
       method == MESH_PREDICTION_MULTI_PARALLELOGRAM ||
       method == MESH_PREDICTION_CONSTRAINED_MULTI_PARALLELOGRAM ||
       method == MESH_PREDICTION_TEX_COORDS_PORTABLE ||
       method == MESH_PREDICTION_GEOMETRIC_NORMAL ||
       method == MESH_PREDICTION_TEX_COORDS_DEPRECATED)) {
    const CornerTable *const ct = source->GetCornerTable();
    const MeshAttributeIndicesEncodingData *const encoding_data =
        source->GetAttributeEncodingData(att_id);
    if (ct == nullptr || encoding_data == nullptr) {
      // No connectivity data found.
      return nullptr;
    }
    // Connectivity data exists.
    const MeshAttributeCornerTable *const att_ct =
        source->GetAttributeCornerTable(att_id);
    if (att_ct != nullptr) {
      typedef MeshPredictionSchemeData<MeshAttributeCornerTable> MeshData;
      MeshData md;
      md.Set(source->mesh(), att_ct,
             &encoding_data->encoded_attribute_value_index_to_corner_map,
             &encoding_data->vertex_to_encoded_attribute_value_index_map);
      MeshPredictionSchemeFactoryT factory;
      auto ret = factory(method, att, transform, md, bitstream_version);
      if (ret) {
        return ret;
      }
    } else {
      typedef MeshPredictionSchemeData<CornerTable> MeshData;
      MeshData md;
      md.Set(source->mesh(), ct,
             &encoding_data->encoded_attribute_value_index_to_corner_map,
             &encoding_data->vertex_to_encoded_attribute_value_index_map);
      MeshPredictionSchemeFactoryT factory;
      auto ret = factory(method, att, transform, md, bitstream_version);
      if (ret) {
        return ret;
      }
    }
  }
  return nullptr;
}